

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O1

void cfl_store_block(MACROBLOCKD *xd,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  uint row;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  uint col;
  TX_SIZE tx_size_00;
  ulong uVar4;
  uint uVar5;
  
  uVar4 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  if ((0x20005UL >> ((ulong)bsize & 0x3f) & 1) == 0) {
    row = 0;
    col = 0;
    if ((0x10003UL >> ((ulong)bsize & 0x3f) & 1) != 0) goto LAB_0038e88e;
  }
  else {
LAB_0038e88e:
    col = 0;
    row = 0;
    if ((xd->mi_row & 1) != 0) {
      row = (uint)((xd->cfl).subsampling_y != 0);
    }
    if ((xd->mi_col & 1U) != 0) {
      col = (uint)((xd->cfl).subsampling_x != 0);
    }
  }
  uVar5 = (uint)block_size_wide[uVar4];
  if (xd->mb_to_right_edge < 0) {
    uVar5 = (uint)block_size_wide[uVar4] +
            (xd->mb_to_right_edge >> ((char)xd->plane[0].subsampling_x + 3U & 0x1f));
  }
  uVar2 = -1 << (*(byte *)(tx_size_wide_log2 + tx_size) & 0x1f);
  uVar2 = ~uVar2 + (uVar5 & 0xfffffffc) & uVar2;
  uVar5 = (uint)block_size_high[uVar4];
  if (xd->mb_to_bottom_edge < 0) {
    uVar5 = (uint)block_size_high[uVar4] +
            (xd->mb_to_bottom_edge >> ((char)xd->plane[0].subsampling_y + 3U & 0x1f));
  }
  uVar3 = -1 << (*(byte *)(tx_size_high_log2 + tx_size) & 0x1f);
  uVar3 = ~uVar3 + (uVar5 & 0xfffffffc) & uVar3;
  if (uVar2 == uVar3) {
    if ((int)uVar2 < 0x20) {
      if (uVar2 == 8) {
        tx_size_00 = '\x01';
        goto LAB_0038ea17;
      }
      if (uVar2 == 0x10) {
        tx_size_00 = '\x02';
        goto LAB_0038ea17;
      }
    }
    else {
      tx_size_00 = '\x04';
      if ((uVar2 == 0x80) || (uVar2 == 0x40)) goto LAB_0038ea17;
      if (uVar2 == 0x20) {
        tx_size_00 = '\x03';
        goto LAB_0038ea17;
      }
    }
  }
  else if ((int)uVar2 < (int)uVar3) {
    if (uVar2 * 2 == uVar3) {
      uVar5 = uVar2 - 4 >> 2;
      if ((uVar2 << 0x1e | uVar5) < 8) {
        bVar1 = (byte)(uVar5 << 3);
        uVar4 = 0xb00000009000705;
LAB_0038e9bf:
        tx_size_00 = (TX_SIZE)(uVar4 >> (bVar1 & 0x3f));
        goto LAB_0038ea17;
      }
    }
    else {
      if (uVar2 == 4) {
        tx_size_00 = '\r';
        goto LAB_0038ea17;
      }
      if (uVar2 == 0x10) {
        tx_size_00 = '\x11';
        goto LAB_0038ea17;
      }
      if (uVar2 == 8) {
        tx_size_00 = '\x0f';
        goto LAB_0038ea17;
      }
    }
  }
  else if (uVar3 * 2 == uVar2) {
    uVar5 = uVar3 - 4 >> 2;
    if ((uVar3 << 0x1e | uVar5) < 8) {
      bVar1 = (byte)(uVar5 << 3);
      uVar4 = 0xc0000000a000806;
      goto LAB_0038e9bf;
    }
  }
  else {
    if (uVar3 == 4) {
      tx_size_00 = '\x0e';
      goto LAB_0038ea17;
    }
    if (uVar3 == 0x10) {
      tx_size_00 = '\x12';
      goto LAB_0038ea17;
    }
    if (uVar3 == 8) {
      tx_size_00 = '\x10';
      goto LAB_0038ea17;
    }
  }
  tx_size_00 = '\0';
LAB_0038ea17:
  cfl_store(&xd->cfl,xd->plane[0].dst.buf,xd->plane[0].dst.stride,row,col,tx_size_00,
            (uint)xd->cur_buf->flags >> 3 & 1);
  return;
}

Assistant:

void cfl_store_block(MACROBLOCKD *const xd, BLOCK_SIZE bsize, TX_SIZE tx_size) {
  CFL_CTX *const cfl = &xd->cfl;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  int row = 0;
  int col = 0;

  if (block_size_high[bsize] == 4 || block_size_wide[bsize] == 4) {
    sub8x8_adjust_offset(cfl, xd->mi_row, xd->mi_col, &row, &col);
  }
  const int width = max_intra_block_width(xd, bsize, AOM_PLANE_Y, tx_size);
  const int height = max_intra_block_height(xd, bsize, AOM_PLANE_Y, tx_size);
  tx_size = get_tx_size(width, height);
  cfl_store(cfl, pd->dst.buf, pd->dst.stride, row, col, tx_size,
            is_cur_buf_hbd(xd));
}